

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

void dense2csr(CUPDLPcsr *csr,CUPDLPdense *dense)

{
  double dVar1;
  cupdlp_int *pcVar2;
  cupdlp_float *pcVar3;
  cupdlp_int cVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  cVar4 = dense->nCols;
  csr->nRows = dense->nRows;
  csr->nCols = cVar4;
  pcVar2 = csr->rowMatBeg;
  *pcVar2 = 0;
  iVar6 = 0;
  for (lVar5 = 0; uVar7 = (ulong)csr->nRows, lVar5 < (long)uVar7; lVar5 = lVar5 + 1) {
    for (iVar8 = 0; iVar8 < csr->nCols; iVar8 = iVar8 + 1) {
      pcVar3 = dense->data;
      dVar1 = pcVar3[(int)uVar7 * iVar8 + (int)lVar5];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        csr->rowMatIdx[iVar6] = iVar8;
        uVar7 = (ulong)(uint)csr->nRows;
        csr->rowMatElem[iVar6] = pcVar3[csr->nRows * iVar8 + (int)lVar5];
        iVar6 = iVar6 + 1;
      }
    }
    pcVar2[lVar5 + 1] = iVar6;
  }
  csr->nMatElem = iVar6;
  return;
}

Assistant:

void dense2csr(CUPDLPcsr *csr, CUPDLPdense *dense) {
  csr->nRows = dense->nRows;
  csr->nCols = dense->nCols;

  cupdlp_int nnz = 0;
  cupdlp_int iCol = 0;
  cupdlp_int iRow = 0;
  csr->rowMatBeg[0] = 0;
  for (iRow = 0; iRow < csr->nRows; ++iRow) {
    for (iCol = 0; iCol < csr->nCols; ++iCol) {
      if (dense->data[iCol * csr->nRows + iRow] != 0) {
        csr->rowMatIdx[nnz] = iCol;
        csr->rowMatElem[nnz] = dense->data[iCol * csr->nRows + iRow];
        ++nnz;
      }
    }
    csr->rowMatBeg[iRow + 1] = nnz;
  }
  csr->nMatElem = nnz;

  return;
}